

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMesh.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChMesh::IntStateGetIncrement
          (ChMesh *this,uint off_x,ChState *x_new,ChState *x,uint off_v,ChStateDelta *Dv)

{
  pointer psVar1;
  element_type *peVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  
  iVar7 = 0;
  iVar6 = 0;
  uVar8 = 0;
  while( true ) {
    psVar1 = (this->vnodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = (ulong)uVar8;
    if ((ulong)((long)(this->vnodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar9)
    break;
    cVar4 = (**(code **)((long)(psVar1[uVar9].
                                super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ChNodeFEAbase + 0x18))();
    if (cVar4 == '\0') {
      peVar2 = (this->vnodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar9].
               super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lVar3 = *(long *)((long)peVar2->_vptr_ChNodeFEAbase + -0x18);
      (**(code **)(*(long *)((long)&peVar2->_vptr_ChNodeFEAbase + lVar3) + 0x48))
                ((long)&peVar2->_vptr_ChNodeFEAbase + lVar3,iVar7 + off_x,x_new,x,iVar6 + off_v,Dv);
      peVar2 = (this->vnodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar9].
               super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lVar3 = *(long *)((long)peVar2->_vptr_ChNodeFEAbase + -0x18);
      iVar5 = (**(code **)(*(long *)((long)&peVar2->_vptr_ChNodeFEAbase + lVar3) + 0x10))
                        ((long)&peVar2->_vptr_ChNodeFEAbase + lVar3);
      iVar7 = iVar5 + iVar7;
      peVar2 = (this->vnodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar9].
               super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lVar3 = *(long *)((long)peVar2->_vptr_ChNodeFEAbase + -0x18);
      iVar5 = (**(code **)(*(long *)((long)&peVar2->_vptr_ChNodeFEAbase + lVar3) + 0x18))
                        ((long)&peVar2->_vptr_ChNodeFEAbase + lVar3);
      iVar6 = iVar5 + iVar6;
    }
    uVar8 = uVar8 + 1;
  }
  return;
}

Assistant:

void ChMesh::IntStateGetIncrement(const unsigned int off_x,
                               const ChState& x_new,
                               const ChState& x,
                               const unsigned int off_v,
                               ChStateDelta& Dv) {
    unsigned int local_off_x = 0;
    unsigned int local_off_v = 0;
    for (unsigned int j = 0; j < vnodes.size(); j++) {
        if (!vnodes[j]->GetFixed()) {
            vnodes[j]->NodeIntStateGetIncrement(off_x + local_off_x, x_new, x, off_v + local_off_v, Dv);
            local_off_x += vnodes[j]->Get_ndof_x();
            local_off_v += vnodes[j]->Get_ndof_w();
        }
    }
}